

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lt.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  uint8_t *memory;
  ulong uVar2;
  ulong uVar3;
  int n_ISIs;
  int n_max_ISIs;
  m256v M;
  uint32_t *ISIs;
  parameters P;
  int local_8c;
  int local_88;
  int local_84;
  m256v local_80;
  uint32_t *local_68;
  parameters local_5c;
  
  local_8c = 0;
  local_84 = 0x20;
  local_68 = (uint32_t *)malloc(0x80);
  local_88 = 0x3c;
  while( true ) {
    while( true ) {
      iVar1 = getopt(argc,argv,"hK:i:");
      if (iVar1 < 0x68) break;
      if (iVar1 == 0x69) {
        parse_esis(&local_8c,&local_84,&local_68,_optarg);
      }
      else if (iVar1 == 0x68) {
        puts(
            "Tool to display an LT matrix.\n\n  -h       Display this help screen.\n  -K #     Set K value.\n  -i #,... Symbol identifiers (ESIs)."
            );
      }
    }
    if (iVar1 == -1) break;
    if (iVar1 == 0x4b) {
      local_88 = atoi(_optarg);
    }
    else if (iVar1 == 0x3f) {
      exit(1);
    }
  }
  parameters_get(local_88);
  iVar1 = local_8c;
  if (local_5c.K == -1) {
    main_cold_1();
LAB_001013d6:
    iVar1 = 1;
  }
  else {
    memory = (uint8_t *)malloc((long)(local_5c.L * local_8c));
    m256v_make(&local_80,iVar1,local_5c.L,memory);
    lt_generate_mat(&local_80,&local_5c,local_8c,local_68);
    if (0 < local_80.n_row) {
      uVar2 = 0;
      do {
        if (0 < local_80.n_col) {
          uVar3 = 0;
          do {
            iVar1 = 0x30;
            if (local_80.e[uVar3 + local_80.rstride * uVar2] != '\0') {
              if (local_80.e[uVar3 + local_80.rstride * uVar2] != '\x01') {
                fprintf(_stderr,"Error: Non-binary matrix entry seen, row=%d, col=%d\n",
                        uVar2 & 0xffffffff,uVar3 & 0xffffffff);
                goto LAB_001013d6;
              }
              iVar1 = 0x31;
            }
            fputc(iVar1,_stdout);
            uVar3 = uVar3 + 1;
          } while ((long)uVar3 < (long)local_80.n_col);
        }
        fputc(10,_stdout);
        uVar2 = uVar2 + 1;
      } while ((long)uVar2 < (long)local_80.n_row);
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int main(int argc, char** argv)
{
	int K = 60;
	int n_ISIs = 0;
	int n_max_ISIs = 32;
	uint32_t* ISIs = malloc(n_max_ISIs * sizeof(uint32_t));

	/* Read command line arguments */
	int c;
	while ((c = getopt(argc, argv, "hK:i:")) != -1) {
		switch (c) {
		case 'h':
			usage();
			break;
		case 'K':
			K = atoi(optarg);
			break;
		case 'i': {
			parse_esis(&n_ISIs, &n_max_ISIs, &ISIs, optarg);
			break;
		}
		case '?':
			exit(EXIT_FAILURE);
		};
	}

	/* Get parameters */
	parameters P = parameters_get(K);
	if (P.K == -1) {
		fprintf(stderr, "Error:  Invalid choice of K.\n");
		return 1;
	}

	/* Generate a suitable LT matrix */
	uint8_t* m = malloc(n_ISIs * P.L * sizeof(uint8_t));
	m256v M = m256v_make(n_ISIs, P.L, m);
	lt_generate_mat(&M, &P, n_ISIs, ISIs);

	/* Print on screen */
	for (int r = 0; r < M.n_row; ++r) {
		for (int c = 0; c < M.n_col; ++c) {
			switch (m256v_get_el(&M, r, c)) {
			case 0:		fputc('0', stdout);	break;
			case 1:		fputc('1', stdout);	break;
			default:
				fprintf(stderr, "Error: Non-binary matrix "
				  "entry seen, row=%d, col=%d\n", r, c);
				return 1;
			}
		}
		fputc('\n', stdout);
	}

	return 0;
}